

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::RegistryTest_reject_different_type_than_gauge_Test::
~RegistryTest_reject_different_type_than_gauge_Test
          (RegistryTest_reject_different_type_than_gauge_Test *this)

{
  RegistryTest_reject_different_type_than_gauge_Test *this_local;
  
  ~RegistryTest_reject_different_type_than_gauge_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(RegistryTest, reject_different_type_than_gauge) {
  const auto same_name = std::string{"same_name"};
  Registry registry{};

  EXPECT_NO_THROW(BuildGauge().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildCounter().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildHistogram().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildInfo().Name(same_name).Register(registry));
  EXPECT_ANY_THROW(BuildSummary().Name(same_name).Register(registry));
}